

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

Test * __thiscall
testing::internal::ParameterizedTestFactory<P256NistzSelectImplTest_SelectW5_Test>::CreateTest
          (ParameterizedTestFactory<P256NistzSelectImplTest_SelectW5_Test> *this)

{
  Test *this_00;
  ParameterizedTestFactory<P256NistzSelectImplTest_SelectW5_Test> *this_local;
  
  WithParamInterface<P256NistzSelectImpl>::SetParam(&this->parameter_);
  this_00 = (Test *)operator_new(0x18);
  P256NistzSelectImplTest_SelectW5_Test::P256NistzSelectImplTest_SelectW5_Test
            ((P256NistzSelectImplTest_SelectW5_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }